

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

void __thiscall ot::commissioner::CommissionerImpl::Disconnect(CommissionerImpl *this)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar1;
  format_args args;
  string_view fmt;
  anon_class_1_0_00000001 local_10a;
  v10 local_109;
  v10 *local_108;
  size_t local_100;
  string local_f8;
  Error local_d8;
  CommissionerImpl *local_b0;
  CommissionerImpl *this_local;
  undefined1 local_98 [16];
  v10 *local_88;
  ulong local_80;
  v10 *local_78;
  size_t sStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  size_t sStack_40;
  CommissionerImpl **local_38;
  undefined1 *local_30;
  CommissionerImpl **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  CommissionerImpl **local_10;
  
  local_b0 = this;
  Disconnect::anon_class_1_0_00000001::operator()(&local_10a);
  local_58 = &local_108;
  local_60 = &local_109;
  bVar1 = ::fmt::v10::operator()(local_60);
  local_100 = bVar1.size_;
  local_108 = (v10 *)bVar1.data_;
  ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
  local_78 = local_108;
  sStack_70 = local_100;
  local_50 = &local_78;
  local_88 = local_108;
  local_80 = local_100;
  local_68 = &local_f8;
  local_48 = local_88;
  sStack_40 = local_80;
  this_local = (CommissionerImpl *)
               ::fmt::v10::make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                         ();
  local_30 = local_98;
  local_38 = &this_local;
  local_20 = 0;
  args.field_1.values_ = in_R9.values_;
  args.desc_ = (unsigned_long_long)local_38;
  fmt.size_ = 0;
  fmt.data_ = (char *)local_80;
  local_28 = local_38;
  local_18 = local_30;
  local_10 = local_38;
  ::fmt::v10::vformat_abi_cxx11_(&local_f8,local_88,fmt,args);
  Error::Error(&local_d8,kCancelled,&local_f8);
  coap::CoapSecure::Disconnect(&this->mBrClient,&local_d8);
  Error::~Error(&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  ProxyClient::ClearMeshLocalPrefix(&this->mProxyClient);
  this->mState = kDisabled;
  return;
}

Assistant:

void CommissionerImpl::Disconnect()
{
    mBrClient.Disconnect(ERROR_CANCELLED("the CoAPs client was disconnected"));
    mProxyClient.ClearMeshLocalPrefix();
    mState = State::kDisabled;
}